

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glob.cpp
# Opt level: O1

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 __thiscall
duckdb::GlobFunctionInit(duckdb *this,ClientContext *context,TableFunctionInitInput *input)

{
  FunctionData *pFVar1;
  MultiFileList *this_00;
  pointer pGVar2;
  pointer *__ptr;
  templated_unique_single_t res;
  _Head_base<0UL,_duckdb::GlobFunctionState_*,_false> local_18;
  
  optional_ptr<const_duckdb::FunctionData,_true>::CheckValid(&input->bind_data);
  pFVar1 = (input->bind_data).ptr;
  local_18._M_head_impl = (GlobFunctionState *)operator_new(0x10);
  ((local_18._M_head_impl)->super_GlobalTableFunctionState)._vptr_GlobalTableFunctionState =
       (_func_int **)&PTR__GlobalTableFunctionState_0249d1b8;
  ((local_18._M_head_impl)->file_list_scan).current_file_idx = 0xffffffffffffffff;
  this_00 = shared_ptr<duckdb::MultiFileList,_true>::operator->
                      ((shared_ptr<duckdb::MultiFileList,_true> *)(pFVar1 + 4));
  pGVar2 = unique_ptr<duckdb::GlobFunctionState,_std::default_delete<duckdb::GlobFunctionState>,_true>
           ::operator->((unique_ptr<duckdb::GlobFunctionState,_std::default_delete<duckdb::GlobFunctionState>,_true>
                         *)&local_18);
  MultiFileList::InitializeScan(this_00,&pGVar2->file_list_scan);
  *(GlobFunctionState **)this = local_18._M_head_impl;
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )this;
}

Assistant:

static unique_ptr<GlobalTableFunctionState> GlobFunctionInit(ClientContext &context, TableFunctionInitInput &input) {
	auto &bind_data = input.bind_data->Cast<GlobFunctionBindData>();
	auto res = make_uniq<GlobFunctionState>();

	bind_data.file_list->InitializeScan(res->file_list_scan);

	return std::move(res);
}